

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender::ByteSizeLong(ItemSimilarityRecommender *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ItemSimilarityRecommender_SimilarItems *value;
  size_t sVar4;
  long lVar5;
  string *psVar6;
  uint local_20;
  int cached_size;
  uint i;
  uint count;
  size_t total_size;
  ItemSimilarityRecommender *this_local;
  
  uVar2 = itemitemsimilarities_size(this);
  _i = (size_t)uVar2;
  for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
    value = itemitemsimilarities(this,local_20);
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
                      (value);
    _i = sVar4 + _i;
  }
  iteminputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = iteminputfeaturename_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    _i = sVar4 + 1 + _i;
  }
  numrecommendationsinputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = numrecommendationsinputfeaturename_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    _i = sVar4 + 1 + _i;
  }
  itemrestrictioninputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = itemrestrictioninputfeaturename_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    _i = sVar4 + 1 + _i;
  }
  itemexclusioninputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = itemexclusioninputfeaturename_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    _i = sVar4 + 1 + _i;
  }
  recommendeditemlistoutputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = recommendeditemlistoutputfeaturename_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    _i = sVar4 + 2 + _i;
  }
  recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    psVar6 = recommendeditemscoreoutputfeaturename_abi_cxx11_(this);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
    _i = sVar4 + 2 + _i;
  }
  bVar1 = has_itemstringids(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>(this->itemstringids_);
    _i = sVar4 + 1 + _i;
  }
  bVar1 = has_itemint64ids(this);
  if (bVar1) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Vector>(this->itemint64ids_);
    _i = sVar4 + 1 + _i;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar3;
  return _i;
}

Assistant:

size_t ItemSimilarityRecommender::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
  {
    unsigned int count = this->itemitemsimilarities_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->itemitemsimilarities(i));
    }
  }

  // string itemInputFeatureName = 10;
  if (this->iteminputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->iteminputfeaturename());
  }

  // string numRecommendationsInputFeatureName = 11;
  if (this->numrecommendationsinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->numrecommendationsinputfeaturename());
  }

  // string itemRestrictionInputFeatureName = 12;
  if (this->itemrestrictioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->itemrestrictioninputfeaturename());
  }

  // string itemExclusionInputFeatureName = 13;
  if (this->itemexclusioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->itemexclusioninputfeaturename());
  }

  // string recommendedItemListOutputFeatureName = 20;
  if (this->recommendeditemlistoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->recommendeditemlistoutputfeaturename());
  }

  // string recommendedItemScoreOutputFeatureName = 21;
  if (this->recommendeditemscoreoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->recommendeditemscoreoutputfeaturename());
  }

  // .CoreML.Specification.StringVector itemStringIds = 2;
  if (this->has_itemstringids()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->itemstringids_);
  }

  // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
  if (this->has_itemint64ids()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->itemint64ids_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}